

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void doctest::detail::filldata<std::basic_istream<wchar_t,_std::char_traits<wchar_t>_>_*>::fill
               (ostream *stream,basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in)

{
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in_local;
  ostream *stream_local;
  
  filldata<const_void_*>::fill(stream,in);
  return;
}

Assistant:

static void fill(std::ostream* stream, const T* in) {
DOCTEST_MSVC_SUPPRESS_WARNING_POP
DOCTEST_CLANG_SUPPRESS_WARNING_WITH_PUSH("-Wmicrosoft-cast")
            filldata<const void*>::fill(stream,
#if DOCTEST_GCC == 0 || DOCTEST_GCC >= DOCTEST_COMPILER(4, 9, 0)
                reinterpret_cast<const void*>(in)
#else
                *reinterpret_cast<const void* const*>(&in)
#endif
            );
DOCTEST_CLANG_SUPPRESS_WARNING_POP
        }